

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O3

MemoryDescr * add_memblock(char *name,lword org,lword len)

{
  MemoryDescr *pMVar1;
  MemoryDescr *pMVar2;
  char *pcVar3;
  MemoryDescr **ppMVar4;
  
  pMVar2 = (MemoryDescr *)alloc(0x28);
  pMVar1 = memory_blocks;
  if (memory_blocks == (MemoryDescr *)0x0) {
    ppMVar4 = &memory_blocks;
  }
  else {
    do {
      ppMVar4 = &pMVar1->next;
      pMVar1 = ((MemoryDescr *)ppMVar4)->next;
    } while (((MemoryDescr *)ppMVar4)->next != (MemoryDescr *)0x0);
  }
  ((MemoryDescr *)ppMVar4)->next = pMVar2;
  pMVar2->next = (MemoryDescr *)0x0;
  pcVar3 = allocstring(name);
  pMVar2->name = pcVar3;
  pMVar2->current = org;
  pMVar2->org = org;
  pMVar2->len = (len >> 0x3f & ~(org + len)) + len;
  return pMVar2;
}

Assistant:

static struct MemoryDescr *add_memblock(const char *name,lword org,lword len)
{
  struct MemoryDescr *last,*new = alloc(sizeof(struct MemoryDescr));

  if (last = memory_blocks) {
    while (last->next)
      last = last->next;
    last->next = new;
  }
  else
    memory_blocks = new;

  new->next = NULL;
  new->name = allocstring(name);
  new->org = new->current = org;
  if (org+len < org)
    len -= org+len+1;
  new->len = len;
  return new;
}